

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_clone.c
# Opt level: O3

mpt_node * mpt_list_clone(mpt_node *src)

{
  mpt_node *insert;
  mpt_node *pmVar1;
  mpt_node *pmVar2;
  mpt_node *curr;
  mpt_node *pmVar3;
  
  if (src == (mpt_node *)0x0) {
LAB_00116bba:
    curr = (mpt_node *)0x0;
  }
  else {
    pmVar2 = (mpt_node *)0x0;
    pmVar3 = (mpt_node *)0x0;
    do {
      insert = mpt_node_clone(src);
      curr = pmVar3;
      if (insert == (mpt_node *)0x0) {
LAB_00116b95:
        if (curr != (mpt_node *)0x0) {
          do {
            pmVar2 = curr->next;
            mpt_node_unlink(curr);
            mpt_node_destroy(curr);
            curr = pmVar2;
          } while (pmVar2 != (mpt_node *)0x0);
          return (mpt_node *)0x0;
        }
        goto LAB_00116bba;
      }
      curr = insert;
      pmVar1 = insert;
      if (pmVar2 != (mpt_node *)0x0) {
        pmVar1 = mpt_gnode_after(pmVar2,insert);
        curr = pmVar3;
      }
      if (src->children != (mpt_node *)0x0) {
        pmVar2 = mpt_list_clone(src->children);
        insert->children = pmVar2;
        if (pmVar2 != (mpt_node *)0x0) goto LAB_00116b95;
      }
      src = src->next;
      pmVar2 = pmVar1;
      pmVar3 = curr;
    } while (src != (mpt_node *)0x0);
  }
  return curr;
}

Assistant:

extern MPT_STRUCT(node) *mpt_list_clone(const MPT_STRUCT(node) *src)
{
	MPT_STRUCT(node) *first = 0, *last = 0;
	
	for (; src; src = src->next) {
		MPT_STRUCT(node) *cpy;
		
		if ((cpy = mpt_node_clone(src))) {
			if (!last) {
				last = first = cpy;
			} else {
				last = mpt_gnode_after(last, cpy);
			}
			/* require empty or cloned subtree */
			if (!src->children
			    || !(cpy->children = mpt_list_clone(src->children))) {
				continue;
			}
		}
		for (cpy = first; cpy; cpy = first) {
			first = first->next;
			mpt_node_unlink(cpy);
			mpt_node_destroy(cpy);
		}
		return 0;
	}
	return first;
}